

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.h
# Opt level: O0

bool miillerTest(BigInt *d,BigInt *n)

{
  bool bVar1;
  size_type sVar2;
  longlong local_1a0;
  BigInt local_198;
  BigInt local_178;
  undefined4 local_154;
  BigInt local_150;
  undefined1 local_130 [8];
  BigInt x;
  BigInt N_minus_one;
  BigInt local_d0;
  BigInt local_a0;
  BigInt local_80;
  BigInt local_60;
  undefined1 local_40 [8];
  BigInt random;
  BigInt *n_local;
  BigInt *d_local;
  
  random._24_8_ = n;
  BigInt::BigInt(&local_60,2);
  sVar2 = std::vector<long_long,_std::allocator<long_long>_>::size(&n->vector_value);
  random_bigint(&local_a0,(int)sVar2);
  BigInt::BigInt((BigInt *)&N_minus_one.sign,4);
  BigInt::operator-(&local_d0,n,(BigInt *)&N_minus_one.sign);
  BigInt::operator%(&local_80,&local_a0,&local_d0);
  BigInt::operator+((BigInt *)local_40,&local_60,&local_80);
  BigInt::~BigInt(&local_80);
  BigInt::~BigInt(&local_d0);
  BigInt::~BigInt((BigInt *)&N_minus_one.sign);
  BigInt::~BigInt(&local_a0);
  BigInt::~BigInt(&local_60);
  BigInt::operator-((BigInt *)&x.sign,n,&one);
  BigInt::BigInt(&local_150,d);
  BigInt::powMod((BigInt *)local_130,(BigInt *)local_40,&local_150,n);
  BigInt::~BigInt(&local_150);
  bVar1 = BigInt::operator==((BigInt *)local_130,&one);
  if ((bVar1) || (bVar1 = BigInt::operator==((BigInt *)local_130,(BigInt *)&x.sign), bVar1)) {
    d_local._7_1_ = true;
  }
  else {
    do {
      bVar1 = BigInt::operator!=(d,(BigInt *)&x.sign);
      if (!bVar1) {
        d_local._7_1_ = false;
        goto LAB_00103d73;
      }
      BigInt::operator*(&local_198,(BigInt *)local_130,(BigInt *)local_130);
      BigInt::operator%(&local_178,&local_198,n);
      BigInt::operator=((BigInt *)local_130,&local_178);
      BigInt::~BigInt(&local_178);
      BigInt::~BigInt(&local_198);
      local_1a0 = 2;
      BigInt::operator*=(d,&local_1a0);
      bVar1 = BigInt::operator==((BigInt *)local_130,&one);
      if (bVar1) {
        d_local._7_1_ = false;
        goto LAB_00103d73;
      }
      bVar1 = BigInt::operator==((BigInt *)local_130,(BigInt *)&x.sign);
    } while (!bVar1);
    d_local._7_1_ = true;
  }
LAB_00103d73:
  local_154 = 1;
  BigInt::~BigInt((BigInt *)local_130);
  BigInt::~BigInt((BigInt *)&x.sign);
  BigInt::~BigInt((BigInt *)local_40);
  return d_local._7_1_;
}

Assistant:

bool miillerTest(BigInt d, BigInt n) {
    //! Pick a random number in [2..n-2]
    //! Corner cases make sure that n > 4
    BigInt random = BigInt(2) + random_bigint(static_cast<int>(n.vector_value.size())) % (n - BigInt(4));

    BigInt N_minus_one = n - one;

    //! Compute a^d % n
    BigInt x = random.powMod(d, n);

    if (x == one || x == N_minus_one)
        return true;

    //! Keep squaring x while one of the following doesn't
    //! happen
    //! (i)   d does not reach n-1
    //! (ii)  (x^2) % n is not 1
    //! (iii) (x^2) % n is not n-1
    while (d != N_minus_one) {
        x = (x * x) % n;
        d *= 2;

        if (x == one) return false;
        if (x == N_minus_one) return true;
    }

    //! Return composite
    return false;
}